

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_table_scan.cpp
# Opt level: O1

void __thiscall
duckdb::TableScanGlobalSourceState::~TableScanGlobalSourceState(TableScanGlobalSourceState *this)

{
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> _Var1;
  
  (this->super_GlobalSourceState)._vptr_GlobalSourceState =
       (_func_int **)&PTR__TableScanGlobalSourceState_019cd9f0;
  ::std::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>::
  ~unique_ptr(&(this->table_filters).
               super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
             );
  DataChunk::~DataChunk(&this->input_chunk);
  _Var1._M_head_impl =
       (this->global_state).
       super_unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
       .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (GlobalTableFunctionState *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_GlobalTableFunctionState[1])();
  }
  (this->global_state).
  super_unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
       (GlobalTableFunctionState *)0x0;
  ::std::vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>::~vector
            (&(this->super_GlobalSourceState).super_StateWithBlockableTasks.blocked_tasks.
              super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>);
  operator_delete(this);
  return;
}

Assistant:

TableScanGlobalSourceState(ClientContext &context, const PhysicalTableScan &op) {
		if (op.dynamic_filters && op.dynamic_filters->HasFilters()) {
			table_filters = op.dynamic_filters->GetFinalTableFilters(op, op.table_filters.get());
		}

		if (op.function.init_global) {
			auto filters = table_filters ? *table_filters : GetTableFilters(op);
			TableFunctionInitInput input(op.bind_data.get(), op.column_ids, op.projection_ids, filters,
			                             op.extra_info.sample_options);

			global_state = op.function.init_global(context, input);
			if (global_state) {
				max_threads = global_state->MaxThreads();
			}
		} else {
			max_threads = 1;
		}
		if (op.function.in_out_function) {
			// this is an in-out function, we need to setup the input chunk
			vector<LogicalType> input_types;
			for (auto &param : op.parameters) {
				input_types.push_back(param.type());
			}
			input_chunk.Initialize(context, input_types);
			for (idx_t c = 0; c < op.parameters.size(); c++) {
				input_chunk.data[c].SetValue(0, op.parameters[c]);
			}
			input_chunk.SetCardinality(1);
		}
	}